

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxylogger.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ILogger *pIVar1;
  MyClass C;
  long *local_28 [2];
  long local_18 [2];
  
  pIVar1 = (ILogger *)operator_new(8);
  *(code **)pIVar1 = liblogger::ProxyLogger::LogDebug;
  liblogger::LogManager::Add(pIVar1);
  MyClass::MyClass((MyClass *)local_28);
  MyClass::Test((MyClass *)local_28);
  liblogger::LogManager::RemoveAll();
  if (local_28[0] != local_18) {
    operator_delete(local_28[0],local_18[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogStdout());

    MyClass C;
    C.Test();

	LogManager::RemoveAll();
	return 0;
}